

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O2

bool EV_DoDoor(EVlDoor type,line_t_conflict *line,AActor *thing,int tag,double speed,int delay,
              int lock,int lightTag,bool boomgen,int topcountdown)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  DDoor *pDVar4;
  DSectorEffect *this;
  DBot *pDVar5;
  DSeqNode *curseq;
  sector_t_conflict *psVar6;
  FSoundID local_3c;
  FSectorTagIterator it;
  
  if ((lock == 0) || (bVar1 = P_CheckKeys(thing,lock,tag != 0), bVar1)) {
    if (tag != 0) {
      it.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
      bVar1 = false;
      it.searchtag = tag;
      while (uVar3 = FSectorTagIterator::Next(&it), -1 < (int)uVar3) {
        psVar6 = sectors + uVar3;
        bVar2 = sector_t::PlaneMoving((sector_t *)psVar6,1);
        if (!bVar2) {
          pDVar4 = (DDoor *)DObject::operator_new(0x88);
          bVar1 = true;
          DDoor::DDoor(pDVar4,(sector_t *)psVar6,type,speed,delay,lightTag,topcountdown);
        }
      }
      return bVar1;
    }
    if (line != (line_t_conflict *)0x0) {
      if (line->sidedef[1] == (side_t *)0x0) {
        local_3c.ID = S_FindSound("*usefail");
        S_Sound(thing,2,&local_3c,1.0,1.0);
      }
      else {
        psVar6 = line->sidedef[1]->sector;
        bVar1 = sector_t::PlaneMoving((sector_t *)psVar6,1);
        if (!bVar1) {
          pDVar4 = (DDoor *)DObject::operator_new(0x88);
          DDoor::DDoor(pDVar4,(sector_t *)psVar6,type,speed,delay,lightTag,topcountdown);
          return true;
        }
        if (!boomgen) {
          this = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&psVar6->ceilingdata);
          bVar1 = DObject::IsKindOf((DObject *)this,DDoor::RegistrationInfo.MyClass);
          if (bVar1) {
            pDVar4 = (DDoor *)GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&psVar6->ceilingdata)
            ;
            if (type != doorRaise) {
              return false;
            }
            if (pDVar4->m_Type != doorRaise) {
              return false;
            }
            if (pDVar4->m_Direction == -1) {
              pDVar4->m_Direction = 1;
              DDoor::DoorSound(pDVar4,true,(DSeqNode *)0x0);
              return false;
            }
            if ((((line->activation & 0x210) == 0) && (thing->player != (player_t *)0x0)) &&
               (pDVar5 = GC::ReadBarrier<DBot>((DBot **)&thing->player->Bot), pDVar5 == (DBot *)0x0)
               ) {
              pDVar4->m_Direction = -1;
              curseq = SN_CheckSequence((sector_t *)psVar6,2);
              DDoor::DoorSound(pDVar4,false,curseq);
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool EV_DoDoor (DDoor::EVlDoor type, line_t *line, AActor *thing,
				int tag, double speed, int delay, int lock, int lightTag, bool boomgen, int topcountdown)
{
	bool		rtn = false;
	int 		secnum;
	sector_t*	sec;

	if (lock != 0 && !P_CheckKeys (thing, lock, tag != 0))
		return false;

	if (tag == 0)
	{		// [RH] manual door
		if (!line)
			return false;

		// if the wrong side of door is pushed, give oof sound
		if (line->sidedef[1] == NULL)			// killough
		{
			S_Sound (thing, CHAN_VOICE, "*usefail", 1, ATTN_NORM);
			return false;
		}

		// get the sector on the second side of activating linedef
		sec = line->sidedef[1]->sector;
		secnum = int(sec-sectors);

		// if door already has a thinker, use it
		if (sec->PlaneMoving(sector_t::ceiling))
		{
			// Boom used remote door logic for generalized doors, even if they are manual
			if (boomgen)
				return false;
			if (sec->ceilingdata->IsKindOf (RUNTIME_CLASS(DDoor)))
			{
				DDoor *door = barrier_cast<DDoor *>(sec->ceilingdata);

				// ONLY FOR "RAISE" DOORS, NOT "OPEN"s
				if (door->m_Type == DDoor::doorRaise && type == DDoor::doorRaise)
				{
					if (door->m_Direction == -1)
					{
						door->m_Direction = 1;	// go back up
						door->DoorSound (true);	// [RH] Make noise
					}
					else if (!(line->activation & (SPAC_Push|SPAC_MPush)))
						// [RH] activate push doors don't go back down when you
						//		run into them (otherwise opening them would be
						//		a real pain).
					{
						if (!thing->player || thing->player->Bot != NULL)
							return false;	// JDC: bad guys never close doors
											//Added by MC: Neither do bots.

						door->m_Direction = -1;	// start going down immediately

						// Start the door close sequence.
						door->DoorSound(false, SN_CheckSequence(sec, CHAN_CEILING));
						return true;
					}
					else
					{
						return false;
					}
				}
			}
			return false;
		}
		if (new DDoor (sec, type, speed, delay, lightTag, topcountdown))
			rtn = true;
	}
	else
	{	// [RH] Remote door

		FSectorTagIterator it(tag);
		while ((secnum = it.Next()) >= 0)
		{
			sec = &sectors[secnum];
			// if the ceiling is already moving, don't start the door action
			if (sec->PlaneMoving(sector_t::ceiling))
				continue;

			if (new DDoor (sec, type, speed, delay, lightTag, topcountdown))
				rtn = true;
		}
				
	}
	return rtn;
}